

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

void TextElementBegin(textwriter_conflict *Out,textwriter_conflict *In,tchar_t *Element)

{
  wchar_t wVar1;
  tchar_t *Msg;
  
  if (In->HasChild == 0) {
    In->HasChild = 1;
    Msg = ">";
    if (In->InsideContent == 0) {
      Msg = ">\n";
    }
    TextWrite(In,Msg);
  }
  Out->CC = In->CC;
  Out->Stream = In->Stream;
  Out->HasChild = 0;
  Out->SafeFormat = In->SafeFormat;
  wVar1 = In->Deep;
  Out->InsideContent = (ulong)(wVar1 == L'\0');
  wVar1 = wVar1 + L'\x02';
  if (In->InsideContent != 0) {
    wVar1 = L'\0';
  }
  Out->Deep = wVar1;
  Out->Element = Element;
  if (In->Deep == L'\0') {
    wVar1 = L'\0';
  }
  TextPrintf(Out,"%*c%s",(ulong)(uint)wVar1,0x3c,Element);
  return;
}

Assistant:

void TextElementBegin(textwriter* Out, textwriter* In, const tchar_t* Element)
{
    if (!In->HasChild)
    {
        In->HasChild = 1;
        if (In->InsideContent)
            TextWrite(In,T(">"));
        else
            TextWrite(In,T(">\n"));
    }
    Out->CC = In->CC;
    Out->Stream = In->Stream;
    Out->HasChild = 0;
    Out->SafeFormat = In->SafeFormat;
    Out->InsideContent = In->Deep==0;
    Out->Deep = In->InsideContent ? 0 : In->Deep+2;
    Out->Element = Element;
    TextPrintf(Out,T("%*c%s"),In->Deep?Out->Deep:0, '<',Element);
}